

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_New_Library(FT_Memory memory,FT_Library *alibrary)

{
  FT_Library pFVar1;
  FT_Error FVar2;
  
  FVar2 = 6;
  if (alibrary != (FT_Library *)0x0 && memory != (FT_Memory)0x0) {
    pFVar1 = (FT_Library)(*memory->alloc)(memory,400);
    if (pFVar1 == (FT_Library)0x0) {
      FVar2 = 0x40;
    }
    else {
      FVar2 = 0;
      memset(&pFVar1->num_modules,0,0x17c);
      pFVar1->memory = memory;
      pFVar1->version_major = 2;
      pFVar1->version_minor = 0xd;
      pFVar1->version_patch = 0;
      pFVar1->refcount = 1;
      *alibrary = pFVar1;
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Library( FT_Memory    memory,
                  FT_Library  *alibrary )
  {
    FT_Library  library = NULL;
    FT_Error    error;


    if ( !memory || !alibrary )
      return FT_THROW( Invalid_Argument );

#ifndef FT_DEBUG_LOGGING
#ifdef FT_DEBUG_LEVEL_ERROR
    /* init debugging support */
    ft_debug_init();
#endif /* FT_DEBUG_LEVEL_ERROR */
#endif /* !FT_DEBUG_LOGGING */

    /* first of all, allocate the library object */
    if ( FT_NEW( library ) )
      return error;

    library->memory = memory;

    library->version_major = FREETYPE_MAJOR;
    library->version_minor = FREETYPE_MINOR;
    library->version_patch = FREETYPE_PATCH;

    library->refcount = 1;

    /* That's ok now */
    *alibrary = library;

    return FT_Err_Ok;
  }